

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

ostream * el::base::debug::operator<<(ostream *os,StackTrace *st)

{
  bool bVar1;
  const_iterator ss;
  ostream *poVar2;
  ostream *in_RDI;
  const_iterator it;
  vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
  *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  __normal_iterator<const_el::base::debug::StackTrace::StackTraceEntry_*,_std::vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>_>
  in_stack_ffffffffffffffd8;
  
  utils::std::
  vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
  ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    ss = utils::std::
         vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_el::base::debug::StackTrace::StackTraceEntry_*,_std::vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_el::base::debug::StackTrace::StackTraceEntry_*,_std::vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 = std::operator<<(in_RDI,"    ");
    in_stack_ffffffffffffffd8 =
         __gnu_cxx::
         __normal_iterator<const_el::base::debug::StackTrace::StackTraceEntry_*,_std::vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>_>
         ::operator++(in_stack_ffffffffffffffd8._M_current,
                      (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_el::base::debug::StackTrace::StackTraceEntry_*,_std::vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>_>
    ::operator*((__normal_iterator<const_el::base::debug::StackTrace::StackTraceEntry_*,_std::vector<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>_>
                 *)&stack0xffffffffffffffd8);
    poVar2 = operator<<((ostream *)ss._M_current,in_stack_ffffffffffffffd8._M_current);
    std::operator<<((ostream *)poVar2,"\n");
  }
  return (ostream *)in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StackTrace& st) {
  std::vector<StackTrace::StackTraceEntry>::const_iterator it = st.m_stack.begin();
  while (it != st.m_stack.end()) {
    os << "    " << *it++ << "\n";
  }
  return os;
}